

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_prelu.cpp
# Opt level: O0

int test_prelu_1(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int in_stack_0000086c;
  Mat *in_stack_00000870;
  undefined1 local_141;
  int in_stack_fffffffffffffec8;
  int w;
  
  w = 0x10;
  RandomMat(0x10,in_stack_fffffffffffffec8);
  bVar3 = false;
  bVar2 = false;
  bVar1 = false;
  iVar4 = test_prelu(in_stack_00000870,in_stack_0000086c);
  local_141 = true;
  if (iVar4 == 0) {
    RandomMat(w,in_stack_fffffffffffffec8);
    bVar3 = true;
    iVar4 = test_prelu(in_stack_00000870,in_stack_0000086c);
    local_141 = true;
    if (iVar4 == 0) {
      RandomMat(w,in_stack_fffffffffffffec8);
      bVar2 = true;
      iVar4 = test_prelu(in_stack_00000870,in_stack_0000086c);
      local_141 = true;
      if (iVar4 == 0) {
        RandomMat(w,in_stack_fffffffffffffec8);
        bVar1 = true;
        iVar4 = test_prelu(in_stack_00000870,in_stack_0000086c);
        local_141 = iVar4 != 0;
      }
    }
  }
  if (bVar1) {
    ncnn::Mat::~Mat((Mat *)0x116918);
  }
  if (bVar2) {
    ncnn::Mat::~Mat((Mat *)0x11692b);
  }
  if (bVar3) {
    ncnn::Mat::~Mat((Mat *)0x116944);
  }
  ncnn::Mat::~Mat((Mat *)0x116951);
  return (uint)local_141;
}

Assistant:

static int test_prelu_1()
{
    return 0
        || test_prelu(RandomMat(6, 16), 16)
        || test_prelu(RandomMat(6, 16), 1)
        || test_prelu(RandomMat(7, 15), 15)
        || test_prelu(RandomMat(7, 15), 1)
        ;
}